

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t Variant_calcSizeBinary(UA_Variant *src,UA_DataType *_)

{
  ushort uVar1;
  UA_DataType *pUVar2;
  size_t sVar3;
  bool local_72;
  bool local_71;
  ulong local_70;
  size_t i;
  size_t memSize;
  uintptr_t ptr;
  size_t length;
  size_t encode_index;
  UA_NodeId typeId;
  UA_Boolean isBuiltin;
  UA_Boolean hasDimensions;
  UA_Variant *pUStack_28;
  UA_Boolean isArray;
  size_t s;
  UA_DataType *__local;
  UA_Variant *src_local;
  
  pUStack_28 = (UA_Variant *)0x1;
  if (src->type == (UA_DataType *)0x0) {
    src_local = (UA_Variant *)0x1;
  }
  else {
    local_71 = true;
    if (src->arrayLength == 0) {
      local_71 = src->data < (void *)0x2;
    }
    typeId.identifier.guid.data4[7] = local_71;
    local_72 = false;
    if (local_71 != false) {
      local_72 = src->arrayDimensionsSize != 0;
    }
    typeId.identifier.guid.data4[6] = local_72;
    typeId.identifier.guid.data4[5] = src->type->field_0x25 & 1;
    UA_NodeId_init((UA_NodeId *)&encode_index);
    length = (size_t)src->type->typeIndex;
    if ((typeId.identifier.guid.data4[5] & 1) == 0) {
      length = 0x19;
      pUVar2 = src->type;
      encode_index._0_2_ = (pUVar2->typeId).namespaceIndex;
      encode_index._2_2_ = *(undefined2 *)&(pUVar2->typeId).field_0x2;
      encode_index._4_4_ = (pUVar2->typeId).identifierType;
      typeId._0_8_ = (pUVar2->typeId).identifier.string.length;
      typeId.identifier.string.length = (size_t)(pUVar2->typeId).identifier.string.data;
      if (encode_index._4_4_ != 0) {
        return 0;
      }
    }
    ptr = src->arrayLength;
    if ((typeId.identifier.guid.data4[7] & 1) == 0) {
      ptr = 1;
    }
    else {
      pUStack_28 = (UA_Variant *)0x5;
    }
    memSize = (size_t)src->data;
    uVar1 = src->type->memSize;
    for (local_70 = 0; local_70 < ptr; local_70 = local_70 + 1) {
      if ((typeId.identifier.guid.data4[5] & 1) == 0) {
        sVar3 = NodeId_calcSizeBinary((UA_NodeId *)&encode_index,(UA_DataType *)0x0);
        pUStack_28 = (UA_Variant *)((long)&pUStack_28->type + sVar3 + 5);
      }
      sVar3 = (*calcSizeBinaryJumpTable[length])((void *)memSize,src->type);
      pUStack_28 = (UA_Variant *)((long)&pUStack_28->type + sVar3);
      memSize = uVar1 + memSize;
    }
    if ((typeId.identifier.guid.data4[6] & 1) != 0) {
      sVar3 = Array_calcSizeBinary(src->arrayDimensions,src->arrayDimensionsSize,UA_TYPES + 5);
      pUStack_28 = (UA_Variant *)((long)&pUStack_28->type + sVar3);
    }
    src_local = pUStack_28;
  }
  return (size_t)src_local;
}

Assistant:

static size_t
Variant_calcSizeBinary(UA_Variant const *src, UA_DataType *_) {
    size_t s = 1; /* encoding byte */
    if(!src->type)
        return s;

    UA_Boolean isArray = src->arrayLength > 0 || src->data <= UA_EMPTY_ARRAY_SENTINEL;
    UA_Boolean hasDimensions = isArray && src->arrayDimensionsSize > 0;
    UA_Boolean isBuiltin = src->type->builtin;

    UA_NodeId typeId;
    UA_NodeId_init(&typeId);
    size_t encode_index = src->type->typeIndex;
    if(!isBuiltin) {
        encode_index = UA_BUILTIN_TYPES_COUNT;
        typeId = src->type->typeId;
        if(typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
            return 0;
    }

    size_t length = src->arrayLength;
    if(isArray)
        s += 4;
    else
        length = 1;

    uintptr_t ptr = (uintptr_t)src->data;
    size_t memSize = src->type->memSize;
    for(size_t i = 0; i < length; ++i) {
        if(!isBuiltin) {
            /* The type is wrapped inside an extensionobject */
            s += NodeId_calcSizeBinary(&typeId, NULL);
            s += 1 + 4; // encoding byte + length
        }
        s += calcSizeBinaryJumpTable[encode_index]((const void*)ptr, src->type);
        ptr += memSize;
    }

    if(hasDimensions)
        s += Array_calcSizeBinary(src->arrayDimensions, src->arrayDimensionsSize,
                                  &UA_TYPES[UA_TYPES_INT32]);
    return s;
}